

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void reset_source(vw *all,size_t numbits)

{
  condition_variable *pcVar1;
  io_buf *buf;
  io_buf *piVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  int *piVar6;
  size_type sVar7;
  code *pcVar8;
  ostream *poVar9;
  char *pcVar10;
  vw_exception *pvVar11;
  code *pcVar12;
  size_t i;
  ulong uVar13;
  parser *ppVar14;
  int f;
  socklen_t size;
  string local_220;
  string local_200;
  string local_1e0;
  sockaddr_in client_address;
  stringstream __msg;
  ostream local_1a0;
  
  buf = all->p->input;
  buf->current = 0;
  ppVar14 = all->p;
  if (ppVar14->write_cache == true) {
    (*ppVar14->output->_vptr_io_buf[7])();
    all->p->write_cache = false;
    (*all->p->output->_vptr_io_buf[8])();
    remove((all->p->output->finalname)._begin);
    piVar2 = all->p->output;
    iVar4 = rename((piVar2->currentname)._begin,(piVar2->finalname)._begin);
    if (iVar4 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar9 = std::operator<<(&local_1a0,
                               "WARN: reset_source(vw& all, size_t numbits) cannot rename: ");
      poVar9 = operator<<(poVar9,&all->p->output->currentname);
      poVar9 = std::operator<<(poVar9," to ");
      operator<<(poVar9,&all->p->output->finalname);
      pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar11,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x8c,&local_1e0);
      __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    while( true ) {
      iVar4 = (*buf->_vptr_io_buf[4])(buf);
      if (CONCAT44(extraout_var,iVar4) == 0) break;
      iVar4 = (*buf->_vptr_io_buf[9])(buf);
      if ((char)iVar4 == '\0') {
        piVar6 = (buf->files)._end;
        (buf->files)._end = piVar6 + -1;
        ___msg = piVar6[-1];
        piVar6 = std::__find_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           ((all->final_prediction_sink)._begin,(all->final_prediction_sink)._end,
                            &__msg);
        if (piVar6 == (all->final_prediction_sink)._end) {
          io_buf::close_file_or_socket(___msg);
        }
      }
      else {
        (*buf->_vptr_io_buf[8])(buf);
      }
    }
    (**buf->_vptr_io_buf)(buf,(all->p->output->finalname)._begin,(ulong)all->stdin_off,1);
    all->p->reader = read_cached_features;
    ppVar14 = all->p;
  }
  if (ppVar14->resettable == true) {
    if (all->daemon == false) {
      uVar13 = 0;
      while( true ) {
        piVar6 = (buf->files)._begin;
        if ((ulong)((long)(buf->files)._end - (long)piVar6 >> 2) <= uVar13) break;
        (*buf->_vptr_io_buf[1])(buf,(ulong)(uint)piVar6[uVar13]);
        uVar5 = cache_numbits(buf,(buf->files)._begin[uVar13]);
        uVar13 = uVar13 + 1;
        if (uVar5 < numbits) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<(&local_1a0,"argh, a bug in caching of some sort!");
          pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar11,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                     ,0xc9,&local_220);
          __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
    }
    else {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&__msg,&ppVar14->output_lock);
      ppVar14 = all->p;
      pcVar1 = &ppVar14->output_done;
      while( true ) {
        sVar7 = std::deque<example_*,_std::allocator<example_*>_>::size
                          (&(ppVar14->ready_parsed_examples).object_queue.c);
        if (sVar7 == 0) break;
        std::condition_variable::wait((unique_lock *)pcVar1);
        ppVar14 = all->p;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__msg);
      io_buf::close_file_or_socket(*(all->p->input->files)._begin);
      v_array<int>::clear(&all->final_prediction_sink);
      v_array<int>::clear(&all->p->input->files);
      size = 0x10;
      f = accept(all->p->bound_sock,(sockaddr *)&client_address,&size);
      if (f < 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar9 = std::operator<<(&local_1a0,"accept: ");
        piVar6 = __errno_location();
        pcVar10 = strerror(*piVar6);
        std::operator<<(poVar9,pcVar10);
        pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar11,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0xb1,&local_200);
        __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      ___msg = f;
      v_array<int>::push_back(&all->final_prediction_sink,(int *)&__msg);
      v_array<int>::push_back(&all->p->input->files,&f);
      bVar3 = isbinary(all->p->input);
      pcVar12 = read_features_string;
      if (bVar3) {
        pcVar12 = read_cached_features;
      }
      pcVar8 = print_result;
      if (bVar3) {
        pcVar8 = binary_print_result;
      }
      all->p->reader = pcVar12;
      all->print = pcVar8;
    }
  }
  return;
}

Assistant:

void reset_source(vw& all, size_t numbits)
{
  io_buf* input = all.p->input;
  input->current = 0;
  if (all.p->write_cache)
  {
    all.p->output->flush();
    all.p->write_cache = false;
    all.p->output->close_file();
    remove(all.p->output->finalname.begin());

    if (0 != rename(all.p->output->currentname.begin(), all.p->output->finalname.begin()))
      THROW("WARN: reset_source(vw& all, size_t numbits) cannot rename: " << all.p->output->currentname << " to "
                                                                          << all.p->output->finalname);

    while (input->num_files() > 0)
      if (input->compressed())
        input->close_file();
      else
      {
        int fd = input->files.pop();
        const auto& fps = all.final_prediction_sink;

        // If the current popped file is not in the list of final predictions sinks, close it.
        if(std::find(fps.cbegin(), fps.cend(), fd) == fps.cend())
          io_buf::close_file_or_socket(fd);
      }
    input->open_file(all.p->output->finalname.begin(), all.stdin_off, io_buf::READ);  // pushing is merged into
                                                                                      // open_file
    all.p->reader = read_cached_features;
  }
  if (all.p->resettable == true)
  {
    if (all.daemon)
    {
      // wait for all predictions to be sent back to client
      {
        std::unique_lock<std::mutex> lock(all.p->output_lock);
        all.p->output_done.wait(lock, [&] { return all.p->ready_parsed_examples.size() == 0; });
      }

      // close socket, erase final prediction sink and socket
      io_buf::close_file_or_socket(all.p->input->files[0]);
      all.final_prediction_sink.clear();
      all.p->input->files.clear();

      sockaddr_in client_address;
      socklen_t size = sizeof(client_address);
      int f = (int)accept(all.p->bound_sock, (sockaddr*)&client_address, &size);
      if (f < 0)
        THROW("accept: " << strerror(errno));

      // note: breaking cluster parallel online learning by dropping support for id

      all.final_prediction_sink.push_back((size_t)f);
      all.p->input->files.push_back(f);

      if (isbinary(*(all.p->input)))
      {
        all.p->reader = read_cached_features;
        all.print = binary_print_result;
      }
      else
      {
        all.p->reader = read_features_string;
        all.print = print_result;
      }
    }
    else
    {
      for (size_t i = 0; i < input->files.size(); i++)
      {
        input->reset_file(input->files[i]);
        if (cache_numbits(input, input->files[i]) < numbits)
          THROW("argh, a bug in caching of some sort!");
      }
    }
  }
}